

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall cmComputeTargetDepends::CollectDepends(cmComputeTargetDepends *this)

{
  size_type sVar1;
  uint local_14;
  uint i;
  cmComputeTargetDepends *this_local;
  
  sVar1 = std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::size(&this->Targets);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             sVar1);
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::size(&this->Targets);
    if (sVar1 <= local_14) break;
    CollectTargetDepends(this,local_14);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectDepends()
{
  // Allocate the dependency graph adjacency lists.
  this->InitialGraph.resize(this->Targets.size());

  // Compute each dependency list.
  for(unsigned int i=0; i < this->Targets.size(); ++i)
    {
    this->CollectTargetDepends(i);
    }
}